

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::languageSpecItem(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AST *pAVar5;
  AST *pAVar6;
  undefined8 uVar7;
  GrpParser *in_RDI;
  ParserException *ex;
  RefAST tmp171_AST;
  RefAST LL_AST;
  RefAST E2_AST;
  RefToken E2;
  RefAST Ilangs_AST;
  RefToken Ilangs;
  RefAST Ilang_AST;
  RefToken Ilang;
  RefAST Vi2_AST;
  RefToken Vi2;
  RefAST Vi1_AST;
  RefAST E1_AST;
  RefToken E1;
  RefAST I_AST;
  RefToken I;
  RefAST languageSpecItem_AST;
  ASTPair currentAST;
  AST *in_stack_fffffffffffffc78;
  ASTPair *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  ASTArray *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  Parser *in_stack_fffffffffffffcc0;
  ASTArray *in_stack_fffffffffffffcd0;
  ASTFactory *in_stack_fffffffffffffcd8;
  ASTArray *in_stack_fffffffffffffcf8;
  NoViableAltException *in_stack_fffffffffffffd00;
  GrpParser *this_00;
  undefined1 local_200 [8];
  undefined1 local_1f8 [31];
  undefined1 local_1d9;
  undefined1 local_1d8 [15];
  byte local_1c9;
  RefCount local_1c8 [72];
  undefined1 local_180 [15];
  undefined1 local_171;
  undefined1 local_170 [24];
  undefined1 local_158 [24];
  undefined1 local_140 [15];
  byte local_131;
  RefCount local_130 [63];
  undefined1 local_f1;
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  undefined1 local_a8 [136];
  RefCount<AST> local_20 [4];
  
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffca0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  ASTPair::ASTPair((ASTPair *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  iVar2 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,1);
  if (iVar2 == 0xd) {
    (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_a8,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffca0,
               (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    this_00 = (GrpParser *)&(in_RDI->super_LLkParser).super_Parser.astFactory;
    RefCount<Token>::RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (RefToken *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    Parser::match(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_c0,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffca0,
               (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    RefCount<Token>::RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (RefToken *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    Parser::match(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    iVar2 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,1);
    if (iVar2 == 0xd) {
      (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_d8,in_RDI,1);
      RefCount<Token>::operator=
                ((RefCount<Token> *)in_stack_fffffffffffffca0,
                 (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      RefCount<Token>::~RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      RefCount<Token>::RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                         ,(RefToken *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0))
      ;
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffca0,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
      RefCount<Token>::~RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      Parser::match(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    }
    else {
      if (((iVar2 != 0x11) && (1 < iVar2 - 0x4bU)) && (1 < iVar2 - 0x50U)) {
        local_f1 = 1;
        uVar7 = __cxa_allocate_exception(0x40);
        (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_f0,in_RDI,1);
        NoViableAltException::NoViableAltException
                  (in_stack_fffffffffffffd00,(RefToken *)in_stack_fffffffffffffcf8);
        local_f1 = 0;
        __cxa_throw(uVar7,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      signedInt(this_00);
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffca0,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    }
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    operator_new(0x20);
    ASTArray::ASTArray(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTFactory::make(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    local_131 = 0;
    pAVar5 = RefCount::operator_cast_to_AST_((RefCount *)local_20);
    pAVar6 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
    if (pAVar5 == pAVar6) {
LAB_0021deff:
      RefCount<AST>::RefCount
                ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    else {
      RefCount<AST>::operator->(local_20);
      AST::getFirstChild(in_stack_fffffffffffffc78);
      local_131 = 1;
      pAVar5 = RefCount::operator_cast_to_AST_(local_130);
      pAVar6 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
      if (pAVar5 == pAVar6) goto LAB_0021deff;
      RefCount<AST>::operator->(local_20);
      AST::getFirstChild(in_stack_fffffffffffffc78);
    }
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    if ((local_131 & 1) != 0) {
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    }
    ASTPair::advanceChildToEnd((ASTPair *)in_stack_fffffffffffffcc0);
  }
  else {
    if (1 < iVar2 - 0x23U) {
      local_1d9 = 1;
      uVar7 = __cxa_allocate_exception(0x40);
      (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_1d8,in_RDI,1);
      NoViableAltException::NoViableAltException
                (in_stack_fffffffffffffd00,(RefToken *)in_stack_fffffffffffffcf8);
      local_1d9 = 0;
      __cxa_throw(uVar7,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    iVar2 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,1);
    if (iVar2 == 0x23) {
      (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_140,in_RDI,1);
      RefCount<Token>::operator=
                ((RefCount<Token> *)in_stack_fffffffffffffca0,
                 (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      RefCount<Token>::~RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      RefCount<Token>::RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                         ,(RefToken *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0))
      ;
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffca0,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
      RefCount<Token>::~RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      Parser::match(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    }
    else {
      if (iVar2 != 0x24) {
        local_171 = 1;
        uVar7 = __cxa_allocate_exception(0x40);
        (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_170,in_RDI,1);
        NoViableAltException::NoViableAltException
                  (in_stack_fffffffffffffd00,(RefToken *)in_stack_fffffffffffffcf8);
        local_171 = 0;
        __cxa_throw(uVar7,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_158,in_RDI,1);
      RefCount<Token>::operator=
                ((RefCount<Token> *)in_stack_fffffffffffffca0,
                 (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      RefCount<Token>::~RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      RefCount<Token>::RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                         ,(RefToken *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0))
      ;
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffca0,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
      RefCount<Token>::~RefCount
                ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      Parser::match(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    }
    (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_180,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffca0,
               (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    RefCount<Token>::RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (RefToken *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    Parser::match(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    languageCodeList(in_RDI);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    operator_new(0x20);
    ASTArray::ASTArray(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                  (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    in_stack_fffffffffffffd00 =
         (NoViableAltException *)
         ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    in_stack_fffffffffffffcf8 =
         ASTArray::add((ASTArray *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       (RefAST *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    ASTFactory::make(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    local_1c9 = 0;
    pAVar5 = RefCount::operator_cast_to_AST_((RefCount *)local_20);
    pAVar6 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
    if (pAVar5 == pAVar6) {
LAB_0021e7c4:
      RefCount<AST>::RefCount
                ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    else {
      RefCount<AST>::operator->(local_20);
      AST::getFirstChild(in_stack_fffffffffffffc78);
      local_1c9 = 1;
      pAVar5 = RefCount::operator_cast_to_AST_(local_1c8);
      pAVar6 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
      if (pAVar5 == pAVar6) goto LAB_0021e7c4;
      RefCount<AST>::operator->(local_20);
      AST::getFirstChild(in_stack_fffffffffffffc78);
    }
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffca0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    if ((local_1c9 & 1) != 0) {
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
    }
    ASTPair::advanceChildToEnd((ASTPair *)in_stack_fffffffffffffcc0);
  }
  iVar2 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,1);
  if (iVar2 == 8) {
    iVar3 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
    uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcb4);
    if (bVar1) {
      iVar4 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,3);
      bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                             ,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      if (bVar1) {
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                   (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        in_stack_fffffffffffffca0 = (ASTArray *)&(in_RDI->super_LLkParser).super_Parser.astFactory;
        (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_1f8,in_RDI,1);
        ASTFactory::create((ASTFactory *)CONCAT44(iVar2,iVar3),(RefToken *)CONCAT44(uVar8,iVar4));
        RefCount<AST>::operator=
                  ((RefCount<AST> *)in_stack_fffffffffffffca0,
                   (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        Parser::match(in_stack_fffffffffffffcc0,iVar2);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        goto LAB_0021ee4a;
      }
    }
  }
  in_stack_fffffffffffffc9c = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,1);
  bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
  in_stack_fffffffffffffc98 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc98);
  if (bVar1) {
    in_stack_fffffffffffffc94 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
    in_stack_fffffffffffffc90 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc90);
    if (bVar1) {
      iVar2 = (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[4])(in_RDI,3);
      bVar1 = BitSet::member((BitSet *)CONCAT44(iVar2,in_stack_fffffffffffffc88),
                             (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      if (bVar1) {
LAB_0021ee4a:
        RefCount<AST>::operator=
                  ((RefCount<AST> *)in_stack_fffffffffffffca0,
                   (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffc80->root);
        ASTPair::~ASTPair(in_stack_fffffffffffffc80);
        return;
      }
    }
  }
  uVar7 = __cxa_allocate_exception(0x40);
  (*(in_RDI->super_LLkParser).super_Parser._vptr_Parser[5])(local_200,in_RDI,1);
  NoViableAltException::NoViableAltException
            (in_stack_fffffffffffffd00,(RefToken *)in_stack_fffffffffffffcf8);
  __cxa_throw(uVar7,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::languageSpecItem() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageSpecItem_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefToken  E1 = nullToken;
	RefAST E1_AST = nullAST;
	RefAST Vi1_AST = nullAST;
	RefToken  Vi2 = nullToken;
	RefAST Vi2_AST = nullAST;
	RefToken  Ilang = nullToken;
	RefAST Ilang_AST = nullAST;
	RefToken  Ilangs = nullToken;
	RefAST Ilangs_AST = nullAST;
	RefToken  E2 = nullToken;
	RefAST E2_AST = nullAST;
	RefAST LL_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			E1 = LT(1);
			E1_AST = astFactory.create(E1);
			match(OP_EQ);
			{
			switch ( LA(1)) {
			case LIT_INT:
			case OP_PLUS:
			case OP_MINUS:
			case LITERAL_true:
			case LITERAL_false:
			{
				signedInt();
				Vi1_AST = returnAST;
				break;
			}
			case IDENT:
			{
				Vi2 = LT(1);
				Vi2_AST = astFactory.create(Vi2);
				match(IDENT);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			languageSpecItem_AST = currentAST.root;
			languageSpecItem_AST = astFactory.make( (new ASTArray(4))->add(E1_AST)->add(I_AST)->add(Vi1_AST)->add(Vi2_AST));
			currentAST.root = languageSpecItem_AST;
			currentAST.child = languageSpecItem_AST!=nullAST &&languageSpecItem_AST->getFirstChild()!=nullAST ?
				languageSpecItem_AST->getFirstChild() : languageSpecItem_AST;
			currentAST.advanceChildToEnd();
			break;
		}
		case LITERAL_language:
		case LITERAL_languages:
		{
			{
			switch ( LA(1)) {
			case LITERAL_language:
			{
				Ilang = LT(1);
				Ilang_AST = astFactory.create(Ilang);
				match(LITERAL_language);
				break;
			}
			case LITERAL_languages:
			{
				Ilangs = LT(1);
				Ilangs_AST = astFactory.create(Ilangs);
				match(LITERAL_languages);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			E2 = LT(1);
			E2_AST = astFactory.create(E2);
			match(OP_EQ);
			languageCodeList();
			LL_AST = returnAST;
			languageSpecItem_AST = currentAST.root;
			languageSpecItem_AST = astFactory.make( (new ASTArray(4))->add(E2_AST)->add(Ilang_AST)->add(Ilangs_AST)->add(LL_AST));
			currentAST.root = languageSpecItem_AST;
			currentAST.child = languageSpecItem_AST!=nullAST &&languageSpecItem_AST->getFirstChild()!=nullAST ?
				languageSpecItem_AST->getFirstChild() : languageSpecItem_AST;
			currentAST.advanceChildToEnd();
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_45.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp171_AST = nullAST;
			tmp171_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_45.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_45);
	}
	returnAST = languageSpecItem_AST;
}